

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O2

void tcmalloc::InvokeNewHookSlow(void *p,size_t s)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  _func_void_void_ptr_unsigned_long *local_68;
  NewHook hooks [7];
  
  uVar1 = base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Traverse
                    ((HookList<void_(*)(const_void_*,_unsigned_long)> *)&base::internal::new_hooks_,
                     &local_68,7);
  uVar2 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    (*hooks[uVar2 - 1])(p,s);
  }
  return;
}

Assistant:

void InvokeNewHookSlow(const void* p, size_t s) {
  if (IsEmergencyPtr(p)) {
    return;
  }
  MallocHook::NewHook hooks[kHookListMaxValues];
  int num_hooks = base::internal::new_hooks_.Traverse(hooks, kHookListMaxValues);
  for (int i = 0; i < num_hooks; i++) {
    hooks[i](p, s);
  }
}